

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O3

void run_test(_func_void *func,char *name,int req)

{
  printf("TEST: %s\n");
  hm_select(0);
  if ((hm_immutable & req) != 0) {
    printf(" \x1b[35m[\x1b[1m!\x1b[22m]\x1b[0m: %s\n",hm_name);
    return;
  }
  printf(anon_var_dwarf_260,hm_name);
  bad = '\0';
  (*func)();
  if (bad != '\0') {
    return;
  }
  puts(&DAT_00103263);
  return;
}

Assistant:

static void run_test(void (*func)(void), const char *name, int req)
{
    printf("TEST: %s\n", name);
    for (int i=0; i<ARRAYSZ(hms); i++)
    {
        hm_select(i);
        if (hm_immutable & req)
        {
            printf(" \e[35m[\e[1m!\e[22m]\e[0m: %s\n", hm_name);
            continue;
        }
        printf(" \e[34m[\e[1m⚒\e[22m]\e[0m: %s\n", hm_name);
        bad=0;
        func();
        if (!bad)
            printf("\e[F \e[32m[\e[1m✓\e[22m]\e[0m\n");
    }
}